

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

void Open_JTalk_clear(Open_JTalk *open_jtalk)

{
  long in_RDI;
  HTS_Engine *in_stack_00000010;
  Mecab *in_stack_00000020;
  
  if (in_RDI != 0) {
    Mecab_clear(in_stack_00000020);
    NJD_clear((NJD *)open_jtalk);
    JPCommon_clear((JPCommon *)open_jtalk);
    HTS_Engine_clear(in_stack_00000010);
  }
  return;
}

Assistant:

void Open_JTalk_clear(Open_JTalk *open_jtalk)
{
	if (open_jtalk == NULL)
	{
		return;
	}
	Mecab_clear(&open_jtalk->mecab);
	NJD_clear(&open_jtalk->njd);
	JPCommon_clear(&open_jtalk->jpcommon);
	HTS_Engine_clear(&open_jtalk->engine);
}